

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_IsFunction(JSContext *ctx,JSValue val)

{
  JSValueUnion JVar1;
  JSObject *p;
  JSContext *ctx_local;
  JSValue val_local;
  uint local_4;
  
  JVar1 = val.u;
  if ((int)val.tag == -1) {
    if (*(short *)((long)JVar1.ptr + 6) == 0xd) {
      local_4 = 1;
    }
    else if (*(short *)((long)JVar1.ptr + 6) == 0x29) {
      local_4 = (uint)*(byte *)(*(long *)((long)JVar1.ptr + 0x30) + 0x20);
    }
    else {
      local_4 = (uint)(ctx->rt->class_array[*(ushort *)((long)JVar1.ptr + 6)].call !=
                      (JSClassCall *)0x0);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BOOL JS_IsFunction(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    p = JS_VALUE_GET_OBJ(val);
    switch(p->class_id) {
    case JS_CLASS_BYTECODE_FUNCTION:
        return TRUE;
    case JS_CLASS_PROXY:
        return p->u.proxy_data->is_func;
    default:
        return (ctx->rt->class_array[p->class_id].call != NULL);
    }
}